

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

ON_Mesh * __thiscall ON_PlaneSurface::CreateMesh(ON_PlaneSurface *this,ON_Mesh *mesh)

{
  bool bVar1;
  int iVar2;
  ON_Mesh *this_00;
  ON_3dPointArray *pOVar3;
  ON_3fVectorArray *pOVar4;
  ON_3dVector *pOVar5;
  ON_2dPointArray *pOVar6;
  double dVar7;
  double dVar8;
  ON_2dPoint local_128;
  ON_2dPoint local_118;
  ON_2dPoint local_108;
  ON_2dPoint local_f8;
  ON_3fVector local_e4;
  ON_3fVector local_d8;
  ON_3fVector local_cc;
  ON_3fVector local_c0;
  ON_3fVector local_b4;
  undefined1 local_a8 [8];
  ON_MeshFace mf;
  ON_3dPoint local_80;
  ON_3dPoint local_68;
  ON_3dPoint local_50;
  byte local_23;
  byte local_22;
  byte local_21;
  bool sp;
  bool fn;
  ON_Mesh *pOStack_20;
  bool vn;
  ON_Mesh *rc;
  ON_Mesh *mesh_local;
  ON_PlaneSurface *this_local;
  
  pOStack_20 = (ON_Mesh *)0x0;
  rc = mesh;
  mesh_local = (ON_Mesh *)this;
  bVar1 = ON_Plane::IsValid(&this->m_plane);
  if (((bVar1) && (bVar1 = ON_Interval::IsValid((ON_Interval *)&this->field_0x90), bVar1)) &&
     (bVar1 = ON_Interval::IsValid((ON_Interval *)&this->field_0xa0), bVar1)) {
    local_21 = 0;
    local_22 = 0;
    local_23 = 1;
    if (rc == (ON_Mesh *)0x0) {
      this_00 = (ON_Mesh *)operator_new(0x6e0);
      ON_Mesh::ON_Mesh(this_00);
      rc = this_00;
    }
    else {
      bVar1 = ON_Mesh::HasDoublePrecisionVertices(rc);
      if (!bVar1) {
        ON_Mesh::UpdateDoublePrecisionVertices(rc);
      }
      bVar1 = ON_Mesh::HasVertexNormals(rc);
      if (bVar1) {
        local_21 = 1;
      }
      bVar1 = ON_Mesh::HasFaceNormals(rc);
      if (bVar1) {
        local_22 = 1;
      }
      bVar1 = ON_Mesh::HasMeshTopology(rc);
      if (bVar1) {
        ON_Mesh::DestroyTopology(rc);
      }
    }
    pOVar3 = &rc->m_dV;
    dVar7 = ON_Interval::operator[]((ON_Interval *)&this->field_0x90,0);
    dVar8 = ON_Interval::operator[]((ON_Interval *)&this->field_0xa0,0);
    ON_Surface::PointAt(&local_50,&this->super_ON_Surface,dVar7,dVar8);
    ON_SimpleArray<ON_3dPoint>::Append(&pOVar3->super_ON_SimpleArray<ON_3dPoint>,&local_50);
    pOVar3 = &rc->m_dV;
    dVar7 = ON_Interval::operator[]((ON_Interval *)&this->field_0x90,1);
    dVar8 = ON_Interval::operator[]((ON_Interval *)&this->field_0xa0,0);
    ON_Surface::PointAt(&local_68,&this->super_ON_Surface,dVar7,dVar8);
    ON_SimpleArray<ON_3dPoint>::Append(&pOVar3->super_ON_SimpleArray<ON_3dPoint>,&local_68);
    pOVar3 = &rc->m_dV;
    dVar7 = ON_Interval::operator[]((ON_Interval *)&this->field_0x90,1);
    dVar8 = ON_Interval::operator[]((ON_Interval *)&this->field_0xa0,1);
    ON_Surface::PointAt(&local_80,&this->super_ON_Surface,dVar7,dVar8);
    ON_SimpleArray<ON_3dPoint>::Append(&pOVar3->super_ON_SimpleArray<ON_3dPoint>,&local_80);
    pOVar3 = &rc->m_dV;
    dVar7 = ON_Interval::operator[]((ON_Interval *)&this->field_0x90,0);
    dVar8 = ON_Interval::operator[]((ON_Interval *)&this->field_0xa0,1);
    ON_Surface::PointAt((ON_3dPoint *)(mf.vi + 2),&this->super_ON_Surface,dVar7,dVar8);
    ON_SimpleArray<ON_3dPoint>::Append
              (&pOVar3->super_ON_SimpleArray<ON_3dPoint>,(ON_3dPoint *)(mf.vi + 2));
    ON_Mesh::UpdateSinglePrecisionVertices(rc);
    local_a8._0_4_ = ON_Mesh::VertexCount(rc);
    local_a8._0_4_ = local_a8._0_4_ + -4;
    local_a8._4_4_ = ON_Mesh::VertexCount(rc);
    local_a8._4_4_ = local_a8._4_4_ + -3;
    iVar2 = ON_Mesh::VertexCount(rc);
    mf.vi[0] = iVar2 + -2;
    iVar2 = ON_Mesh::VertexCount(rc);
    mf.vi[1] = iVar2 + -1;
    ON_SimpleArray<ON_MeshFace>::Append(&rc->m_F,(ON_MeshFace *)local_a8);
    if ((local_21 & 1) != 0) {
      pOVar4 = &rc->m_N;
      pOVar5 = ON_Plane::Normal(&this->m_plane);
      ON_3fVector::ON_3fVector(&local_b4,pOVar5);
      ON_SimpleArray<ON_3fVector>::Append(&pOVar4->super_ON_SimpleArray<ON_3fVector>,&local_b4);
      pOVar4 = &rc->m_N;
      pOVar5 = ON_Plane::Normal(&this->m_plane);
      ON_3fVector::ON_3fVector(&local_c0,pOVar5);
      ON_SimpleArray<ON_3fVector>::Append(&pOVar4->super_ON_SimpleArray<ON_3fVector>,&local_c0);
      pOVar4 = &rc->m_N;
      pOVar5 = ON_Plane::Normal(&this->m_plane);
      ON_3fVector::ON_3fVector(&local_cc,pOVar5);
      ON_SimpleArray<ON_3fVector>::Append(&pOVar4->super_ON_SimpleArray<ON_3fVector>,&local_cc);
      pOVar4 = &rc->m_N;
      pOVar5 = ON_Plane::Normal(&this->m_plane);
      ON_3fVector::ON_3fVector(&local_d8,pOVar5);
      ON_SimpleArray<ON_3fVector>::Append(&pOVar4->super_ON_SimpleArray<ON_3fVector>,&local_d8);
    }
    if ((local_22 & 1) != 0) {
      pOVar4 = &rc->m_FN;
      pOVar5 = ON_Plane::Normal(&this->m_plane);
      ON_3fVector::ON_3fVector(&local_e4,pOVar5);
      ON_SimpleArray<ON_3fVector>::Append(&pOVar4->super_ON_SimpleArray<ON_3fVector>,&local_e4);
    }
    if ((local_23 & 1) != 0) {
      pOVar6 = &rc->m_S;
      dVar7 = ON_Interval::operator[]((ON_Interval *)&this->field_0x90,0);
      dVar8 = ON_Interval::operator[]((ON_Interval *)&this->field_0xa0,0);
      ON_2dPoint::ON_2dPoint(&local_f8,dVar7,dVar8);
      ON_SimpleArray<ON_2dPoint>::Append(&pOVar6->super_ON_SimpleArray<ON_2dPoint>,&local_f8);
      pOVar6 = &rc->m_S;
      dVar7 = ON_Interval::operator[]((ON_Interval *)&this->field_0x90,1);
      dVar8 = ON_Interval::operator[]((ON_Interval *)&this->field_0xa0,0);
      ON_2dPoint::ON_2dPoint(&local_108,dVar7,dVar8);
      ON_SimpleArray<ON_2dPoint>::Append(&pOVar6->super_ON_SimpleArray<ON_2dPoint>,&local_108);
      pOVar6 = &rc->m_S;
      dVar7 = ON_Interval::operator[]((ON_Interval *)&this->field_0x90,1);
      dVar8 = ON_Interval::operator[]((ON_Interval *)&this->field_0xa0,1);
      ON_2dPoint::ON_2dPoint(&local_118,dVar7,dVar8);
      ON_SimpleArray<ON_2dPoint>::Append(&pOVar6->super_ON_SimpleArray<ON_2dPoint>,&local_118);
      pOVar6 = &rc->m_S;
      dVar7 = ON_Interval::operator[]((ON_Interval *)&this->field_0x90,0);
      dVar8 = ON_Interval::operator[]((ON_Interval *)&this->field_0xa0,1);
      ON_2dPoint::ON_2dPoint(&local_128,dVar7,dVar8);
      ON_SimpleArray<ON_2dPoint>::Append(&pOVar6->super_ON_SimpleArray<ON_2dPoint>,&local_128);
    }
    pOStack_20 = rc;
  }
  return pOStack_20;
}

Assistant:

ON_Mesh* ON_PlaneSurface::CreateMesh(
  ON_Mesh* mesh
) const
{
  ON_Mesh* rc = nullptr;

  if (m_plane.IsValid() && m_domain[0].IsValid() && m_domain[1].IsValid())
  {
    bool vn = false, fn = false, sp = true;

    if (mesh == nullptr) mesh = new ON_Mesh();
    else
    {
      if (!mesh->HasDoublePrecisionVertices()) mesh->UpdateDoublePrecisionVertices();
      if (mesh->HasVertexNormals()) vn = true;
      if (mesh->HasFaceNormals()) fn = true;
      if (mesh->HasMeshTopology()) mesh->DestroyTopology();
    }

    mesh->m_dV.Append(PointAt(m_domain[0][0], m_domain[1][0]));
    mesh->m_dV.Append(PointAt(m_domain[0][1], m_domain[1][0]));
    mesh->m_dV.Append(PointAt(m_domain[0][1], m_domain[1][1]));
    mesh->m_dV.Append(PointAt(m_domain[0][0], m_domain[1][1]));
    mesh->UpdateSinglePrecisionVertices();

    {
      ON_MeshFace mf;
      mf.vi[0] = mesh->VertexCount() - 4;
      mf.vi[1] = mesh->VertexCount() - 3;
      mf.vi[2] = mesh->VertexCount() - 2;
      mf.vi[3] = mesh->VertexCount() - 1;
      mesh->m_F.Append(mf);
    }

    if (vn)
    {
      mesh->m_N.Append((ON_3fVector)m_plane.Normal());
      mesh->m_N.Append((ON_3fVector)m_plane.Normal());
      mesh->m_N.Append((ON_3fVector)m_plane.Normal());
      mesh->m_N.Append((ON_3fVector)m_plane.Normal());
    }

    if (fn)
    {
      mesh->m_FN.Append((ON_3fVector)m_plane.Normal());
    }

    if (sp)
    {
      mesh->m_S.Append(ON_2dPoint(m_domain[0][0], m_domain[1][0]));
      mesh->m_S.Append(ON_2dPoint(m_domain[0][1], m_domain[1][0]));
      mesh->m_S.Append(ON_2dPoint(m_domain[0][1], m_domain[1][1]));
      mesh->m_S.Append(ON_2dPoint(m_domain[0][0], m_domain[1][1]));
    }

    rc = mesh;
  }
  return rc;
}